

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to)

{
  undefined8 *puVar1;
  pointer pOVar2;
  Instruction *pIVar3;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  __node_type *p_Var8;
  uint uVar9;
  uint uVar10;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  undefined1 local_f0 [32];
  undefined1 local_d0 [8];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c8;
  IRContext *local_c0;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_b8;
  uint32_t local_ac;
  undefined1 local_a8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_88;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  __node_type *local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_ac = from;
  local_b8._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this,&local_ac);
  if (local_b8._M_cur != (__node_type *)0x0) {
    local_c0 = this->module_->context_;
    puVar7 = *(undefined8 **)((long)local_b8._M_cur + 0x10);
    puVar1 = *(undefined8 **)((long)local_b8._M_cur + 0x18);
    if (puVar7 != puVar1) {
      do {
        pIVar3 = Instruction::Clone((Instruction *)*puVar7,this->module_->context_);
        local_f0._0_8_ = &PTR__SmallVector_00b02ef8;
        local_f0._24_8_ = (long)local_f0 + 0x10;
        local_d0 = (undefined1  [8])0x0;
        local_f0._16_4_ = to;
        local_f0._8_8_ = (_func_int **)0x1;
        uVar5 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
        if (pIVar3->has_type_id_ == false) {
          uVar5 = (ulong)pIVar3->has_result_id_;
        }
        pOVar2 = (pIVar3->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(pIVar3->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                -0x5555555555555555;
        if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar5 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_f0);
        local_f0._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_d0 != (undefined1  [8])0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     local_d0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(this->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>,
                   pIVar3);
        IRContext::AnalyzeUses
                  (local_c0,(this->module_->annotations_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              (&local_48,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)((long)&((local_b8._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                          ._M_storage._M_storage + 0x20));
    local_78 = (__node_type *)
               local_48.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    p_Var8 = (__node_type *)
             local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pIVar3 = *(Instruction **)
                  &(((_Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      *)&p_Var8->super__Hash_node_base)->_M_storage)._M_storage;
        local_b8._M_cur = p_Var8;
        if (pIVar3->opcode_ == OpGroupMemberDecorate) {
          IRContext::ForgetUses(local_c0,pIVar3);
          uVar9 = (int)((ulong)((long)(pIVar3->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar3->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
          if (1 < uVar9) {
            uVar10 = 1;
            do {
              uVar6 = (ulong)uVar10;
              pOVar2 = (pIVar3->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(pIVar3->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                      -0x5555555555555555;
              if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
LAB_00553ef4:
                __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                              ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
              }
              pOVar2 = pOVar2 + uVar6;
              local_f0._0_4_ = pOVar2->type;
              local_f0._8_8_ = &PTR__SmallVector_00b02ef8;
              local_f0._16_4_ = (array<signed_char,_4UL>)0x0;
              local_f0._20_4_ = (array<signed_char,_4UL>)0x0;
              local_d0 = (undefined1  [8])(local_f0 + 0x18);
              local_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),&pOVar2->words);
              _Var4._M_head_impl = local_c8._M_head_impl;
              if (local_c8._M_head_impl ==
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                _Var4._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0
                ;
              }
              if (*((_Var4._M_head_impl)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start == local_ac) {
                local_70._0_8_ = &PTR__SmallVector_00b02ef8;
                local_70._24_8_ = local_70 + 0x10;
                local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                local_70._8_8_ = 1;
                local_a8._0_4_ = 1;
                local_a8._8_8_ = &PTR__SmallVector_00b02ef8;
                local_a8._16_4_ = (array<signed_char,_4UL>)0x0;
                local_a8._20_4_ = (array<signed_char,_4UL>)0x0;
                local_88._M_head_impl =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 0x18);
                local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                local_70._16_4_ = to;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
                           (SmallVector<unsigned_int,_2UL> *)local_70);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&pIVar3->operands_,(Operand *)local_a8);
                local_a8._8_8_ = &PTR__SmallVector_00b02ef8;
                if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )local_80._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_80,local_80._M_head_impl);
                }
                local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                local_70._0_8_ = &PTR__SmallVector_00b02ef8;
                if (local_50._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_50,local_50._M_head_impl);
                }
                uVar5 = (ulong)(uVar10 + 1);
                pOVar2 = (pIVar3->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar6 = ((long)(pIVar3->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                        -0x5555555555555555;
                if (uVar6 < uVar5 || uVar6 - uVar5 == 0) goto LAB_00553ef4;
                pOVar2 = pOVar2 + uVar5;
                local_f0._0_4_ = pOVar2->type;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),&pOVar2->words);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&pIVar3->operands_,(Operand *)local_f0);
              }
              local_f0._8_8_ = &PTR__SmallVector_00b02ef8;
              if (local_c8._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_c8,local_c8._M_head_impl);
              }
              uVar10 = uVar10 + 2;
            } while (uVar10 < uVar9);
          }
        }
        else {
          if (pIVar3->opcode_ != OpGroupDecorate) {
            __assert_fail("false && \"Unexpected decoration instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                          ,0x22d,
                          "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t)"
                         );
          }
          IRContext::ForgetUses(local_c0,pIVar3);
          local_a8._0_8_ = &PTR__SmallVector_00b02ef8;
          local_a8._24_8_ = (long)local_a8 + 0x10;
          local_88._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8._16_4_ = to;
          local_a8._8_8_ = (_func_int **)0x1;
          local_f0._0_4_ = 1;
          local_f0._8_8_ = &PTR__SmallVector_00b02ef8;
          local_f0._16_4_ = (array<signed_char,_4UL>)0x0;
          local_f0._20_4_ = (array<signed_char,_4UL>)0x0;
          local_d0 = (undefined1  [8])((long)local_f0 + 0x18);
          local_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_f0 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_a8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&pIVar3->operands_,(Operand *)local_f0);
          local_f0._8_8_ = &PTR__SmallVector_00b02ef8;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_c8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_c8,local_c8._M_head_impl);
          }
          local_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8._0_8_ = &PTR__SmallVector_00b02ef8;
          if (local_88._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_88,local_88._M_head_impl);
          }
        }
        IRContext::AnalyzeUses(local_c0,pIVar3);
        p_Var8 = (__node_type *)
                 &(local_b8._M_cur)->
                  super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
        ;
      } while ((__node_type *)
               &(local_b8._M_cur)->
                super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
               != local_78);
    }
    if ((__node_type *)
        local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (__node_type *)0x0) {
      operator_delete(local_48.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(uint32_t from, uint32_t to) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    // simply clone decoration and change |target-id| to |to|
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }
  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        context->ForgetUses(inst);
        // add |to| to list of decorated id's
        inst->AddOperand(
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
        context->AnalyzeUses(inst);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        context->ForgetUses(inst);
        // for each (id == from), add (to, literal) as operands
        const uint32_t num_operands = inst->NumOperands();
        for (uint32_t i = 1; i < num_operands; i += 2) {
          Operand op = inst->GetOperand(i);
          if (op.words[0] == from) {  // add new pair of operands: (to, literal)
            inst->AddOperand(
                Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
            op = inst->GetOperand(i + 1);
            inst->AddOperand(std::move(op));
          }
        }
        context->AnalyzeUses(inst);
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}